

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall CS248::DynamicScene::Scene::~Scene(Scene *this)

{
  vector<CS248::StaticScene::DirectionalLight_*,_std::allocator<CS248::StaticScene::DirectionalLight_*>_>
  *unaff_retaddr;
  
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)unaff_retaddr);
  std::vector<CS248::StaticScene::SpotLight_*,_std::allocator<CS248::StaticScene::SpotLight_*>_>::
  ~vector((vector<CS248::StaticScene::SpotLight_*,_std::allocator<CS248::StaticScene::SpotLight_*>_>
           *)unaff_retaddr);
  std::vector<CS248::StaticScene::PointLight_*,_std::allocator<CS248::StaticScene::PointLight_*>_>::
  ~vector((vector<CS248::StaticScene::PointLight_*,_std::allocator<CS248::StaticScene::PointLight_*>_>
           *)unaff_retaddr);
  std::
  vector<CS248::StaticScene::DirectionalLight_*,_std::allocator<CS248::StaticScene::DirectionalLight_*>_>
  ::~vector(unaff_retaddr);
  std::
  set<CS248::DynamicScene::SceneLight_*,_std::less<CS248::DynamicScene::SceneLight_*>,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
  ::~set((set<CS248::DynamicScene::SceneLight_*,_std::less<CS248::DynamicScene::SceneLight_*>,_std::allocator<CS248::DynamicScene::SceneLight_*>_>
          *)0x1bdc4d);
  std::
  set<CS248::DynamicScene::SceneObject_*,_std::less<CS248::DynamicScene::SceneObject_*>,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
  ::~set((set<CS248::DynamicScene::SceneObject_*,_std::less<CS248::DynamicScene::SceneObject_*>,_std::allocator<CS248::DynamicScene::SceneObject_*>_>
          *)0x1bdc5b);
  return;
}

Assistant:

Scene::~Scene() { }